

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int WebPPictureYUVAToARGB(WebPPicture *picture)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  WebPUpsampleLinePairFunc p_Var9;
  WebPPicture *in_RDI;
  int x;
  uint8_t *src;
  uint32_t *argb_dst;
  uint8_t *top_v;
  uint8_t *top_u;
  WebPUpsampleLinePairFunc upsample;
  uint8_t *cur_y;
  uint8_t *cur_v;
  uint8_t *cur_u;
  uint8_t *dst;
  int argb_stride;
  int height;
  int width;
  int y;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int local_74;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  int local_1c;
  int local_c;
  
  if (in_RDI == (WebPPicture *)0x0) {
    local_c = 0;
  }
  else if (((in_RDI->y == (uint8_t *)0x0) || (in_RDI->u == (uint8_t *)0x0)) ||
          (in_RDI->v == (uint8_t *)0x0)) {
    local_c = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_NULL_PARAMETER);
  }
  else if (((in_RDI->colorspace & WEBP_CSP_ALPHA_BIT) == WEBP_YUV420) ||
          (in_RDI->a != (uint8_t *)0x0)) {
    if ((in_RDI->colorspace & WEBP_CSP_UV_MASK) == WEBP_YUV420) {
      iVar7 = WebPPictureAllocARGB
                        ((WebPPicture *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                         (int)in_stack_ffffffffffffff70);
      if (iVar7 == 0) {
        local_c = 0;
      }
      else {
        in_RDI->use_argb = 1;
        iVar7 = in_RDI->width;
        uVar1 = in_RDI->height;
        iVar2 = in_RDI->argb_stride;
        iVar8 = iVar2 << 2;
        puVar5 = in_RDI->argb;
        local_38 = in_RDI->u;
        local_40 = in_RDI->v;
        local_48 = in_RDI->y;
        p_Var9 = WebPGetLinePairConverter(0);
        (*p_Var9)(local_48,(uint8_t *)0x0,local_38,local_40,local_38,local_40,(uint8_t *)puVar5,
                  (uint8_t *)0x0,iVar7);
        local_48 = local_48 + in_RDI->y_stride;
        local_30 = (uint8_t *)((long)puVar5 + (long)iVar8);
        for (local_1c = 1; local_1c + 1 < (int)uVar1; local_1c = local_1c + 2) {
          iVar3 = in_RDI->uv_stride;
          iVar4 = in_RDI->uv_stride;
          (*p_Var9)(local_48,local_48 + in_RDI->y_stride,local_38,local_40,local_38 + iVar3,
                    local_40 + iVar4,local_30,local_30 + iVar8,iVar7);
          local_48 = local_48 + (in_RDI->y_stride << 1);
          local_30 = local_30 + (iVar2 << 3);
          local_40 = local_40 + iVar4;
          local_38 = local_38 + iVar3;
        }
        if ((1 < (int)uVar1) && ((uVar1 & 1) == 0)) {
          (*p_Var9)(local_48,(uint8_t *)0x0,local_38,local_40,local_38,local_40,local_30,
                    (uint8_t *)0x0,iVar7);
        }
        if ((in_RDI->colorspace & WEBP_CSP_ALPHA_BIT) != WEBP_YUV420) {
          for (local_1c = 0; local_1c < (int)uVar1; local_1c = local_1c + 1) {
            puVar5 = in_RDI->argb;
            iVar8 = local_1c * in_RDI->argb_stride;
            puVar6 = in_RDI->a;
            iVar2 = in_RDI->a_stride;
            for (local_74 = 0; local_74 < iVar7; local_74 = local_74 + 1) {
              puVar5[(long)iVar8 + (long)local_74] =
                   puVar5[(long)iVar8 + (long)local_74] & 0xffffff |
                   (uint)puVar6[(long)local_74 + (long)(local_1c * iVar2)] << 0x18;
            }
          }
        }
        local_c = 1;
      }
    }
    else {
      local_c = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_INVALID_CONFIGURATION);
    }
  }
  else {
    local_c = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_NULL_PARAMETER);
  }
  return local_c;
}

Assistant:

int WebPPictureYUVAToARGB(WebPPicture* picture) {
  if (picture == NULL) return 0;
  if (picture->y == NULL || picture->u == NULL || picture->v == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if ((picture->colorspace & WEBP_CSP_ALPHA_BIT) && picture->a == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if ((picture->colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  // Allocate a new argb buffer (discarding the previous one).
  if (!WebPPictureAllocARGB(picture, picture->width, picture->height)) return 0;
  picture->use_argb = 1;

  // Convert
  {
    int y;
    const int width = picture->width;
    const int height = picture->height;
    const int argb_stride = 4 * picture->argb_stride;
    uint8_t* dst = (uint8_t*)picture->argb;
    const uint8_t* cur_u = picture->u, *cur_v = picture->v, *cur_y = picture->y;
    WebPUpsampleLinePairFunc upsample =
        WebPGetLinePairConverter(ALPHA_OFFSET > 0);

    // First row, with replicated top samples.
    upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, width);
    cur_y += picture->y_stride;
    dst += argb_stride;
    // Center rows.
    for (y = 1; y + 1 < height; y += 2) {
      const uint8_t* const top_u = cur_u;
      const uint8_t* const top_v = cur_v;
      cur_u += picture->uv_stride;
      cur_v += picture->uv_stride;
      upsample(cur_y, cur_y + picture->y_stride, top_u, top_v, cur_u, cur_v,
               dst, dst + argb_stride, width);
      cur_y += 2 * picture->y_stride;
      dst += 2 * argb_stride;
    }
    // Last row (if needed), with replicated bottom samples.
    if (height > 1 && !(height & 1)) {
      upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, width);
    }
    // Insert alpha values if needed, in replacement for the default 0xff ones.
    if (picture->colorspace & WEBP_CSP_ALPHA_BIT) {
      for (y = 0; y < height; ++y) {
        uint32_t* const argb_dst = picture->argb + y * picture->argb_stride;
        const uint8_t* const src = picture->a + y * picture->a_stride;
        int x;
        for (x = 0; x < width; ++x) {
          argb_dst[x] = (argb_dst[x] & 0x00ffffffu) | ((uint32_t)src[x] << 24);
        }
      }
    }
  }
  return 1;
}